

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void blend_solid(plutovg_surface_t *surface,plutovg_operator_t op,uint32_t solid,
                plutovg_span_buffer_t *span_buffer)

{
  composition_solid_function_t p_Var1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  
  p_Var1 = composition_solid_table[op];
  iVar2 = (span_buffer->spans).size;
  puVar3 = &((span_buffer->spans).data)->coverage;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    (*p_Var1)((uint32_t *)
              (surface->data +
              (long)((plutovg_span_t *)(puVar3 + -0xc))->x * 4 +
              (long)surface->stride * (long)*(int *)(puVar3 + -4)),*(int *)(puVar3 + -8),solid,
              (uint32_t)*puVar3);
    puVar3 = puVar3 + 0x10;
  }
  return;
}

Assistant:

static void blend_solid(plutovg_surface_t* surface, plutovg_operator_t op, uint32_t solid, const plutovg_span_buffer_t* span_buffer)
{
    composition_solid_function_t func = composition_solid_table[op];
    int count = span_buffer->spans.size;
    const plutovg_span_t* spans = span_buffer->spans.data;
    while(count--) {
        uint32_t* target = (uint32_t*)(surface->data + spans->y * surface->stride) + spans->x;
        func(target, spans->len, solid, spans->coverage);
        ++spans;
    }
}